

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall
DBaseStatusBar::DrSmallNumberOuter(DBaseStatusBar *this,int val,int x,int y,bool center)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  int local_24;
  int digit;
  bool center_local;
  int y_local;
  int x_local;
  int val_local;
  DBaseStatusBar *this_local;
  
  pDVar1 = screen;
  local_24 = 0;
  y_local = val;
  if (999 < val) {
    y_local = 999;
  }
  if (99 < y_local) {
    local_24 = y_local / 100;
    pFVar2 = FImageCollection::operator[](&this->Images,local_24 + 0x17);
    DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)x,(double)y,0x400013a6,(ulong)center,0);
    y_local = y_local % 100;
  }
  pDVar1 = screen;
  if ((9 < y_local) || (local_24 != 0)) {
    pFVar2 = FImageCollection::operator[](&this->Images,y_local / 10 + 0x17);
    DCanvas::DrawTexture
              ((DCanvas *)pDVar1,pFVar2,(double)(x + 4),(double)y,0x400013a6,(ulong)center,0);
    y_local = y_local % 10;
  }
  pDVar1 = screen;
  pFVar2 = FImageCollection::operator[](&this->Images,y_local + 0x17);
  DCanvas::DrawTexture
            ((DCanvas *)pDVar1,pFVar2,(double)(x + 8),(double)y,0x400013a6,(ulong)center,0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumberOuter (int val, int x, int y, bool center) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		screen->DrawTexture (Images[imgSmNumbers + digit], x, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		screen->DrawTexture (Images[imgSmNumbers + digit], x+4, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 10;
	}
	screen->DrawTexture (Images[imgSmNumbers + val], x+8, y,
		DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
}